

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy_toplex_map.h
# Opt level: O2

bool __thiscall
Gudhi::Lazy_toplex_map::insert_simplex<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (Lazy_toplex_map *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_range
          )

{
  unordered_map<unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  *this_00;
  PriorityQueue *this_01;
  _Rb_tree_node_base *__k;
  handle_type handle;
  size_type sVar1;
  size_type sVar2;
  _Hashtable<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>,std::__detail::_Identity,Gudhi::Toplex_map::Sptr_equal,Gudhi::Toplex_map::Sptr_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  size_t sVar6;
  _Base_ptr p_Var7;
  long lVar8;
  value_type *pvVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  pair<std::__detail::_Node_iterator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_true,_true>,_bool>
  pVar13;
  handle_type v_handle;
  Simplex_ptr sptr;
  Simplex sigma;
  marked_heap_node<std::pair<unsigned_long,_unsigned_long>_> *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [56];
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
  set<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)&local_60,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(vertex_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(vertex_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_finish);
  this->empty_toplex = local_60._M_impl.super__Rb_tree_header._M_node_count == 0;
  std::
  make_shared<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>&>
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_a8);
  this_00 = &this->t0;
  this_01 = &this->cleaning_priority;
  uVar10 = 0;
  for (p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &local_60._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    __k = p_Var7 + 1;
    sVar2 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&this_00->_M_h,(key_type *)__k);
    if (sVar2 == 0) {
      local_98._0_8_ = local_98 + 0x30;
      local_98._8_8_ = (_Base_ptr)0x1;
      local_98._16_8_ = (_Base_ptr)0x0;
      local_98._24_8_ = 0;
      local_98._32_8_ = 0x3f800000;
      local_98._40_8_ = 0;
      local_98._48_8_ = (__node_base_ptr)0x0;
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>>,std::allocator<std::pair<unsigned_long_const,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<unsigned_long_const&,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>>,std::allocator<std::pair<unsigned_long_const,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)this_00,__k,
                 (_Hashtable<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Identity,_Gudhi::Toplex_map::Sptr_equal,_Gudhi::Toplex_map::Sptr_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)local_98);
      std::
      _Hashtable<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Identity,_Gudhi::Toplex_map::Sptr_equal,_Gudhi::Toplex_map::Sptr_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Identity,_Gudhi::Toplex_map::Sptr_equal,_Gudhi::Toplex_map::Sptr_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_98);
      local_98._8_8_ = *(undefined8 *)__k;
      local_98._0_8_ = (_Base_ptr)0x0;
      local_b0 = (marked_heap_node<std::pair<unsigned_long,_unsigned_long>_> *)
                 boost::heap::
                 fibonacci_heap<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
                 ::push(this_01,(value_type *)local_98);
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,unsigned_long>>*,boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,unsigned_long>,boost::parameter::aux::flat_like_arg_list<>>::type,std::pair<unsigned_long,unsigned_long>&>>,std::allocator<std::pair<unsigned_long_const,boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,unsigned_long>>*,boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,unsigned_long>,boost::parameter::aux::flat_like_arg_list<>>::type,std::pair<unsigned_long,unsigned_long>&>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<unsigned_long_const&,boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,unsigned_long>>*,boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,unsigned_long>,boost::parameter::aux::flat_like_arg_list<>>::type,std::pair<unsigned_long,unsigned_long>&>&>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,unsigned_long>>*,boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,unsigned_long>,boost::parameter::aux::flat_like_arg_list<>>::type,std::pair<unsigned_long,unsigned_long>&>>,std::allocator<std::pair<unsigned_long_const,boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,unsigned_long>>*,boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,unsigned_long>,boost::parameter::aux::flat_like_arg_list<>>::type,std::pair<unsigned_long,unsigned_long>&>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->cp_handles,__k,&local_b0);
    }
    p_Var3 = (_Hashtable<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>,std::__detail::_Identity,Gudhi::Toplex_map::Sptr_equal,Gudhi::Toplex_map::Sptr_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)this_00,(key_type *)__k);
    pVar13 = std::
             _Hashtable<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>,std::__detail::_Identity,Gudhi::Toplex_map::Sptr_equal,Gudhi::Toplex_map::Sptr_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
             ::
             _M_emplace<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>&>
                       (p_Var3,local_a8);
    uVar10 = pVar13._8_4_;
    pmVar4 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,_unsigned_long>_>_*,_boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::aux::flat_like_arg_list<>_>::type,_std::pair<unsigned_long,_unsigned_long>_&>_>,_std::allocator<std::pair<const_unsigned_long,_boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,_unsigned_long>_>_*,_boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::aux::flat_like_arg_list<>_>::type,_std::pair<unsigned_long,_unsigned_long>_&>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,_unsigned_long>_>_*,_boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::aux::flat_like_arg_list<>_>::type,_std::pair<unsigned_long,_unsigned_long>_&>_>,_std::allocator<std::pair<const_unsigned_long,_boost::heap::detail::node_handle<boost::heap::detail::marked_heap_node<std::pair<unsigned_long,_unsigned_long>_>_*,_boost::heap::detail::make_fibonacci_heap_base<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::aux::flat_like_arg_list<>_>::type,_std::pair<unsigned_long,_unsigned_long>_&>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->cp_handles,(key_type *)__k);
    handle.node_ = pmVar4->node_;
    pmVar5 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)this_00,(key_type *)__k);
    sVar1 = (pmVar5->_M_h)._M_element_count;
    sVar6 = get_gamma0_lbound(this,*(Vertex *)__k);
    local_98._0_8_ = sVar1 - sVar6;
    local_98._8_8_ = *(undefined8 *)__k;
    boost::heap::
    fibonacci_heap<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
    ::update(this_01,handle,(const_reference)local_98);
  }
  sVar6 = this->size;
  if ((uVar10 & 1) != 0) {
    sVar6 = sVar6 + 1;
    this->size = sVar6;
  }
  auVar11._8_4_ = (int)(sVar6 >> 0x20);
  auVar11._0_8_ = sVar6;
  auVar11._12_4_ = 0x45300000;
  lVar8 = this->size_lbound + 1;
  auVar12._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar12._0_8_ = lVar8;
  auVar12._12_4_ = 0x45300000;
  if (((auVar12._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) * this->BETTA <
      (auVar11._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)) {
    pvVar9 = boost::heap::
             fibonacci_heap<std::pair<unsigned_long,_unsigned_long>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
             ::top(this_01);
    clean(this,pvVar9->second);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_60);
  return (bool)((byte)uVar10 & 1);
}

Assistant:

bool Lazy_toplex_map::insert_simplex(const Input_vertex_range &vertex_range) {
  Simplex sigma(vertex_range.begin(), vertex_range.end());
  // Check empty face management
  empty_toplex = (sigma.size() == 0);
  Simplex_ptr sptr = std::make_shared<Simplex>(sigma);
  bool inserted = false;
  for (const Vertex &v : sigma) {
    if (!t0.count(v)) {
      t0.emplace(v, Simplex_ptr_set());
      auto v_handle = cleaning_priority.push(std::make_pair(0, v));
      cp_handles.emplace(v, v_handle);
    }
    inserted = t0.at(v).emplace(sptr).second;
    cleaning_priority.update(cp_handles.at(v), std::make_pair(t0.at(v).size() - get_gamma0_lbound(v), v));
  }
  if (inserted) size++;
  if (size > (size_lbound + 1) * BETTA) clean(cleaning_priority.top().second);
  return inserted;
}